

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VideoHppGenerator.cpp
# Opt level: O2

string * __thiscall
VideoHppGenerator::generateStructs
          (string *__return_storage_ptr__,VideoHppGenerator *this,RequireData *requireData,
          string *title)

{
  pointer pbVar1;
  const_iterator cVar2;
  pointer __k;
  string local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VideoHppGenerator::StructureData>
  local_68;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  pbVar1 = (requireData->types).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (__k = (requireData->types).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start; __k != pbVar1; __k = __k + 1) {
    cVar2 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VideoHppGenerator::StructureData>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VideoHppGenerator::StructureData>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VideoHppGenerator::StructureData>_>_>
            ::find(&(this->m_structs)._M_t,__k);
    if ((_Rb_tree_header *)cVar2._M_node != &(this->m_structs)._M_t._M_impl.super__Rb_tree_header) {
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VideoHppGenerator::StructureData>
      ::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VideoHppGenerator::StructureData,_true>
                (&local_68,
                 (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VideoHppGenerator::StructureData>
                  *)(cVar2._M_node + 1));
      generateStruct(&local_a8,this,&local_68);
      std::operator+(&local_88,"\n",&local_a8);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (__return_storage_ptr__,&local_88);
      std::__cxx11::string::~string((string *)&local_88);
      std::__cxx11::string::~string((string *)&local_a8);
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VideoHppGenerator::StructureData>
      ::~pair(&local_68);
    }
  }
  if (__return_storage_ptr__->_M_string_length != 0) {
    std::operator+(&local_a8,"\n    //=== ",title);
    std::operator+(&local_88,&local_a8," ===\n");
    std::operator+(&local_68.first,&local_88,__return_storage_ptr__);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (__return_storage_ptr__,&local_68.first);
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&local_a8);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string VideoHppGenerator::generateStructs( RequireData const & requireData, std::string const & title ) const
{
  std::string str;
  for ( auto const & type : requireData.types )
  {
    auto structIt = m_structs.find( type );
    if ( structIt != m_structs.end() )
    {
      str += "\n" + generateStruct( *structIt );
    }
  }
  if ( !str.empty() )
  {
    str = "\n    //=== " + title + " ===\n" + str;
  }
  return str;
}